

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_bmp_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  uint pad_00;
  int iVar1;
  int pad;
  void *data_local;
  int comp_local;
  int y_local;
  int x_local;
  stbi__write_context *s_local;
  
  pad_00 = x * -3 & 3;
  iVar1 = stbiw__outfile(s,-1,-1,x,y,comp,1,data,0,pad_00,"11 4 22 44 44 22 444444",0x42,0x4d,
                         (x * 3 + pad_00) * y + 0x36,0,0,0x36,0x28,x,y,1,0x18,0,0,0,0,0,0);
  return iVar1;
}

Assistant:

static int stbi_write_bmp_core(stbi__write_context *s, int x, int y, int comp,
                               const void *data) {
  int pad = (-x * 3) & 3;
  return stbiw__outfile(s, -1, -1, x, y, comp, 1, (void *)data, 0, pad,
                        "11 4 22 4"
                        "4 44 22 444444",
                        'B', 'M', 14 + 40 + (x * 3 + pad) * y, 0, 0,
                        14 + 40,                             // file header
                        40, x, y, 1, 24, 0, 0, 0, 0, 0, 0);  // bitmap header
}